

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O3

xmlChar * htmlGetMetaEncoding(htmlDocPtr doc)

{
  _xmlNode *p_Var1;
  bool bVar2;
  int iVar3;
  xmlChar *pxVar4;
  _xmlNode *p_Var5;
  xmlChar *str;
  _xmlAttr *p_Var6;
  
  if (doc == (htmlDocPtr)0x0) {
    return (xmlChar *)0x0;
  }
  p_Var5 = doc->children;
  if (p_Var5 == (_xmlNode *)0x0) {
    return (xmlChar *)0x0;
  }
  do {
    if ((p_Var5->type == XML_ELEMENT_NODE) && (p_Var5->name != (xmlChar *)0x0)) {
      iVar3 = xmlStrEqual(p_Var5->name,"html");
      if (iVar3 != 0) {
        p_Var5 = p_Var5->children;
        if (p_Var5 == (_xmlNode *)0x0) {
          return (xmlChar *)0x0;
        }
        break;
      }
      iVar3 = xmlStrEqual(p_Var5->name,"head");
      if (iVar3 != 0) goto LAB_00152133;
      iVar3 = xmlStrEqual(p_Var5->name,(xmlChar *)"meta");
      if (iVar3 != 0) goto LAB_00152142;
    }
    p_Var5 = p_Var5->next;
    if (p_Var5 == (_xmlNode *)0x0) {
      return (xmlChar *)0x0;
    }
  } while( true );
LAB_001520fa:
  if ((p_Var5->type == XML_ELEMENT_NODE) && (p_Var5->name != (xmlChar *)0x0)) {
    iVar3 = xmlStrEqual(p_Var5->name,"head");
    if (iVar3 != 0) {
LAB_00152133:
      p_Var5 = p_Var5->children;
      if (p_Var5 == (_xmlNode *)0x0) {
        return (xmlChar *)0x0;
      }
LAB_00152142:
      do {
        if ((((p_Var5->type == XML_ELEMENT_NODE) && (p_Var5->name != (xmlChar *)0x0)) &&
            (iVar3 = xmlStrEqual(p_Var5->name,(xmlChar *)"meta"), iVar3 != 0)) &&
           (p_Var6 = p_Var5->properties, p_Var6 != (_xmlAttr *)0x0)) {
          bVar2 = false;
          str = (xmlChar *)0x0;
          do {
            p_Var1 = p_Var6->children;
            if (((p_Var1 != (_xmlNode *)0x0) && (p_Var1->type == XML_TEXT_NODE)) &&
               (p_Var1->next == (_xmlNode *)0x0)) {
              pxVar4 = p_Var1->content;
              iVar3 = xmlStrcasecmp(p_Var6->name,(xmlChar *)"http-equiv");
              if ((iVar3 == 0) &&
                 (iVar3 = xmlStrcasecmp(pxVar4,(xmlChar *)"Content-Type"), iVar3 == 0)) {
                bVar2 = true;
              }
              else if ((pxVar4 != (xmlChar *)0x0) &&
                      (iVar3 = xmlStrcasecmp(p_Var6->name,"content"), iVar3 == 0)) {
                str = pxVar4;
              }
              if ((bVar2) && (str != (xmlChar *)0x0)) {
                pxVar4 = xmlStrstr(str,"charset=");
                if ((pxVar4 == (xmlChar *)0x0) &&
                   ((pxVar4 = xmlStrstr(str,(xmlChar *)"Charset="), pxVar4 == (xmlChar *)0x0 &&
                    (pxVar4 = xmlStrstr(str,(xmlChar *)"CHARSET="), pxVar4 == (xmlChar *)0x0)))) {
                  pxVar4 = xmlStrstr(str,(xmlChar *)"charset =");
                  if (((pxVar4 == (xmlChar *)0x0) &&
                      (pxVar4 = xmlStrstr(str,(xmlChar *)"Charset ="), pxVar4 == (xmlChar *)0x0)) &&
                     (pxVar4 = xmlStrstr(str,(xmlChar *)"CHARSET ="), pxVar4 == (xmlChar *)0x0)) {
                    return (xmlChar *)0x0;
                  }
                  pxVar4 = pxVar4 + 9;
                }
                else {
                  pxVar4 = pxVar4 + 8;
                }
                for (; (*pxVar4 == ' ' || (*pxVar4 == '\t')); pxVar4 = pxVar4 + 1) {
                }
                return pxVar4;
              }
            }
            p_Var6 = p_Var6->next;
          } while (p_Var6 != (_xmlAttr *)0x0);
        }
        p_Var5 = p_Var5->next;
        if (p_Var5 == (_xmlNode *)0x0) {
          return (xmlChar *)0x0;
        }
      } while( true );
    }
    iVar3 = xmlStrEqual(p_Var5->name,(xmlChar *)"meta");
    if (iVar3 != 0) goto LAB_00152142;
  }
  p_Var5 = p_Var5->next;
  if (p_Var5 == (_xmlNode *)0x0) {
    return (xmlChar *)0x0;
  }
  goto LAB_001520fa;
}

Assistant:

const xmlChar *
htmlGetMetaEncoding(htmlDocPtr doc) {
    htmlNodePtr cur;
    const xmlChar *content;
    const xmlChar *encoding;

    if (doc == NULL)
	return(NULL);
    cur = doc->children;

    /*
     * Search the html
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrEqual(cur->name, BAD_CAST"html"))
		break;
	    if (xmlStrEqual(cur->name, BAD_CAST"head"))
		goto found_head;
	    if (xmlStrEqual(cur->name, BAD_CAST"meta"))
		goto found_meta;
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(NULL);
    cur = cur->children;

    /*
     * Search the head
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrEqual(cur->name, BAD_CAST"head"))
		break;
	    if (xmlStrEqual(cur->name, BAD_CAST"meta"))
		goto found_meta;
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(NULL);
found_head:
    cur = cur->children;

    /*
     * Search the meta elements
     */
found_meta:
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrEqual(cur->name, BAD_CAST"meta")) {
		xmlAttrPtr attr = cur->properties;
		int http;
		const xmlChar *value;

		content = NULL;
		http = 0;
		while (attr != NULL) {
		    if ((attr->children != NULL) &&
		        (attr->children->type == XML_TEXT_NODE) &&
		        (attr->children->next == NULL)) {
			value = attr->children->content;
			if ((!xmlStrcasecmp(attr->name, BAD_CAST"http-equiv"))
			 && (!xmlStrcasecmp(value, BAD_CAST"Content-Type")))
			    http = 1;
			else if ((value != NULL)
			 && (!xmlStrcasecmp(attr->name, BAD_CAST"content")))
			    content = value;
			if ((http != 0) && (content != NULL))
			    goto found_content;
		    }
		    attr = attr->next;
		}
	    }
	}
	cur = cur->next;
    }
    return(NULL);

found_content:
    encoding = xmlStrstr(content, BAD_CAST"charset=");
    if (encoding == NULL)
	encoding = xmlStrstr(content, BAD_CAST"Charset=");
    if (encoding == NULL)
	encoding = xmlStrstr(content, BAD_CAST"CHARSET=");
    if (encoding != NULL) {
	encoding += 8;
    } else {
	encoding = xmlStrstr(content, BAD_CAST"charset =");
	if (encoding == NULL)
	    encoding = xmlStrstr(content, BAD_CAST"Charset =");
	if (encoding == NULL)
	    encoding = xmlStrstr(content, BAD_CAST"CHARSET =");
	if (encoding != NULL)
	    encoding += 9;
    }
    if (encoding != NULL) {
	while ((*encoding == ' ') || (*encoding == '\t')) encoding++;
    }
    return(encoding);
}